

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::SparseTextureAllocationTestCase::iterate(SparseTextureAllocationTestCase *this)

{
  bool bVar1;
  int iVar2;
  ContextInfo *this_00;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  bool local_489;
  bool local_461;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  MessageBuilder local_428;
  allocator<char> local_2a1;
  string local_2a0 [32];
  int *local_280;
  GLint *format_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_270;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_268;
  const_iterator formIter_1;
  GLint *target_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_250;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_248;
  const_iterator iter_1;
  MessageBuilder local_220;
  allocator<char> local_89;
  string local_88 [32];
  int *local_68;
  GLint *format;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  const_iterator formIter;
  GLint *target;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  const_iterator iter;
  bool result;
  Functions *gl;
  SparseTextureAllocationTestCase *this_local;
  Functions *gl_00;
  
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_sparse_texture");
  if (bVar1) {
    pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    gl_00 = (Functions *)CONCAT44(extraout_var,iVar2);
    iter._M_current._7_1_ = 1;
    local_38._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(&this->mSupportedTargets);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_30,
               &local_38);
    while( true ) {
      target = (GLint *)std::vector<int,_std::allocator<int>_>::end(&this->mSupportedTargets);
      bVar1 = __gnu_cxx::operator!=
                        (&local_30,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         &target);
      if (!bVar1) break;
      formIter._M_current =
           __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
           operator*(&local_30);
      local_58._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin(&this->mSupportedInternalFormats);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_50,
                 &local_58);
      while( true ) {
        format = (GLint *)std::vector<int,_std::allocator<int>_>::end
                                    (&this->mSupportedInternalFormats);
        bVar1 = __gnu_cxx::operator!=
                          (&local_50,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           &format);
        if (!bVar1) break;
        local_68 = __gnu_cxx::
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_50);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_88,"",&local_89);
        std::__cxx11::stringstream::str((string *)&this->mLog);
        std::__cxx11::string::~string(local_88);
        std::allocator<char>::~allocator(&local_89);
        poVar4 = std::operator<<((ostream *)&this->field_0x88,
                                 "Testing sparse texture allocation for target: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*formIter._M_current);
        poVar4 = std::operator<<(poVar4,", format: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*local_68);
        std::operator<<(poVar4," - ");
        bVar1 = positiveTesting(this,gl_00,*formIter._M_current,*local_68);
        local_461 = false;
        if (bVar1) {
          bVar1 = verifyTexParameterErrors(this,gl_00,*formIter._M_current,*local_68);
          local_461 = false;
          if (bVar1) {
            bVar1 = verifyTexStorageVirtualPageSizeIndexError
                              (this,gl_00,*formIter._M_current,*local_68);
            local_461 = false;
            if (bVar1) {
              bVar1 = verifyTexStorageFullArrayCubeMipmapsError
                                (this,gl_00,*formIter._M_current,*local_68);
              local_461 = false;
              if (bVar1) {
                local_461 = verifyTexStorageInvalidValueErrors
                                      (this,gl_00,*formIter._M_current,*local_68);
              }
            }
          }
        }
        iter._M_current._7_1_ = local_461;
        if (local_461 == false) {
          pTVar5 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_220,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
          std::__cxx11::stringstream::str();
          pMVar6 = tcu::MessageBuilder::operator<<
                             (&local_220,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &iter_1);
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [5])0x2c0b9be);
          tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&iter_1);
          tcu::MessageBuilder::~MessageBuilder(&local_220);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Fail");
          return STOP;
        }
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&local_50);
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_30);
    }
    local_250._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(&this->mFullArrayTargets);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_248,
               &local_250);
    while( true ) {
      target_1 = (GLint *)std::vector<int,_std::allocator<int>_>::end(&this->mFullArrayTargets);
      bVar1 = __gnu_cxx::operator!=
                        (&local_248,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         &target_1);
      if (!bVar1) break;
      formIter_1._M_current =
           __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
           operator*(&local_248);
      local_270._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin(&this->mSupportedInternalFormats);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_268,
                 &local_270);
      while( true ) {
        format_1 = (GLint *)std::vector<int,_std::allocator<int>_>::end
                                      (&this->mSupportedInternalFormats);
        bVar1 = __gnu_cxx::operator!=
                          (&local_268,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           &format_1);
        if (!bVar1) break;
        local_280 = __gnu_cxx::
                    __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&local_268);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_2a0,"",&local_2a1);
        std::__cxx11::stringstream::str((string *)&this->mLog);
        std::__cxx11::string::~string(local_2a0);
        std::allocator<char>::~allocator(&local_2a1);
        poVar4 = std::operator<<((ostream *)&this->field_0x88,
                                 "Testing sparse texture allocation for target [full array]: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*formIter_1._M_current);
        poVar4 = std::operator<<(poVar4,", format: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*local_280);
        std::operator<<(poVar4," - ");
        bVar1 = verifyTexStorageFullArrayCubeMipmapsError
                          (this,gl_00,*formIter_1._M_current,*local_280);
        local_489 = false;
        if (bVar1) {
          local_489 = verifyTexStorageInvalidValueErrors
                                (this,gl_00,*formIter_1._M_current,*local_280);
        }
        iter._M_current._7_1_ = local_489;
        if (local_489 == false) {
          pTVar5 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_428,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
          std::__cxx11::stringstream::str();
          pMVar6 = tcu::MessageBuilder::operator<<(&local_428,&local_448);
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [5])0x2c0b9be);
          tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_448);
          tcu::MessageBuilder::~MessageBuilder(&local_428);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Fail");
          return STOP;
        }
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&local_268);
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_248);
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SparseTextureAllocationTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool result = true;

	for (std::vector<glw::GLint>::const_iterator iter = mSupportedTargets.begin(); iter != mSupportedTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::vector<glw::GLint>::const_iterator formIter = mSupportedInternalFormats.begin();
			 formIter != mSupportedInternalFormats.end(); ++formIter)
		{
			const GLint& format = *formIter;

			mLog.str("");
			mLog << "Testing sparse texture allocation for target: " << target << ", format: " << format << " - ";

			result = positiveTesting(gl, target, format) && verifyTexParameterErrors(gl, target, format) &&
					 verifyTexStorageVirtualPageSizeIndexError(gl, target, format) &&
					 verifyTexStorageFullArrayCubeMipmapsError(gl, target, format) &&
					 verifyTexStorageInvalidValueErrors(gl, target, format);

			if (!result)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << mLog.str() << "Fail" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		}
	}

	for (std::vector<glw::GLint>::const_iterator iter = mFullArrayTargets.begin(); iter != mFullArrayTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::vector<glw::GLint>::const_iterator formIter = mSupportedInternalFormats.begin();
			 formIter != mSupportedInternalFormats.end(); ++formIter)
		{
			const GLint& format = *formIter;

			mLog.str("");
			mLog << "Testing sparse texture allocation for target [full array]: " << target << ", format: " << format
				 << " - ";

			result = verifyTexStorageFullArrayCubeMipmapsError(gl, target, format) &&
					 verifyTexStorageInvalidValueErrors(gl, target, format);

			if (!result)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << mLog.str() << "Fail" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}